

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperSwitch.c
# Opt level: O3

float Map_SwitchCutRefDeref(Map_Node_t *pNode,Map_Cut_t *pCut,int fPhase,int fReference)

{
  int *piVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  Map_Node_t *pNode_00;
  long lVar9;
  float in_XMM0_Da;
  float fVar10;
  float local_2c;
  
  cVar2 = *(char *)((long)&pNode->p2 + 4);
  local_2c = in_XMM0_Da;
  if (cVar2 != '\x01') {
    if (*(long *)((long)pNode->tArrival + (long)(int)pCut * 0x28) == 0) {
      __assert_fail("pCut->M[fPhase].pSuperBest",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperSwitch.c"
                    ,0x71,"float Map_SwitchCutRefDeref(Map_Node_t *, Map_Cut_t *, int, int)");
    }
    if ('\0' < cVar2) {
      lVar9 = 0;
      do {
        lVar4 = *(long *)(pNode->nRefAct + lVar9 * 2 + -2);
        uVar5 = Map_CutGetLeafPhase((Map_Cut_t *)pNode,(int)pCut,(int)lVar9);
        if (fPhase == 0) {
          if ((*(long *)(lVar4 + 0x90) == 0) || (*(long *)(lVar4 + 0x98) == 0)) {
            lVar6 = (long)(int)uVar5;
            piVar1 = (int *)(lVar4 + 0x20 + lVar6 * 4);
            *piVar1 = *piVar1 + -1;
            if ((*piVar1 == 0) && (*(long *)(lVar4 + 0x90 + lVar6 * 8) == 0)) {
              local_2c = local_2c + *(float *)(lVar4 + 0x38);
            }
            iVar8 = *(int *)(lVar4 + 0x28);
            *(int *)(lVar4 + 0x28) = iVar8 + -1;
            if (iVar8 < 2) {
              iVar8 = *(int *)(lVar4 + 0x20 + lVar6 * 4);
              goto LAB_00400e37;
            }
          }
          else {
            *(int *)(lVar4 + 0x28) = *(int *)(lVar4 + 0x28) + -1;
            iVar3 = *(int *)(lVar4 + 0x20 + (long)(int)uVar5 * 4);
            iVar8 = iVar3 + -1;
            *(int *)(lVar4 + 0x20 + (long)(int)uVar5 * 4) = iVar8;
            if (iVar3 < 2) {
LAB_00400e37:
              if (iVar8 < 0) {
                __assert_fail("pNodeChild->nRefAct[fPhaseChild] >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperSwitch.c"
                              ,0x9f,
                              "float Map_SwitchCutRefDeref(Map_Node_t *, Map_Cut_t *, int, int)");
              }
              goto LAB_00400e3b;
            }
          }
        }
        else {
          if ((*(long *)(lVar4 + 0x90) == 0) || (*(long *)(lVar4 + 0x98) == 0)) {
            lVar6 = (long)(int)uVar5;
            iVar8 = *(int *)(lVar4 + 0x20 + lVar6 * 4);
            *(int *)(lVar4 + 0x20 + lVar6 * 4) = iVar8 + 1;
            if ((iVar8 == 0) && (*(long *)(lVar4 + 0x90 + lVar6 * 8) == 0)) {
              local_2c = local_2c + *(float *)(lVar4 + 0x38);
            }
            iVar8 = *(int *)(lVar4 + 0x28);
            *(int *)(lVar4 + 0x28) = iVar8 + 1;
          }
          else {
            *(int *)(lVar4 + 0x28) = *(int *)(lVar4 + 0x28) + 1;
            iVar8 = *(int *)(lVar4 + 0x20 + (long)(int)uVar5 * 4);
            *(int *)(lVar4 + 0x20 + (long)(int)uVar5 * 4) = iVar8 + 1;
          }
          if (0 < iVar8) goto LAB_00400e79;
LAB_00400e3b:
          uVar7 = (ulong)(int)uVar5;
          pNode_00 = *(Map_Node_t **)(lVar4 + 0x90 + uVar7 * 8);
          if (pNode_00 == (Map_Node_t *)0x0) {
            uVar7 = (ulong)(uVar5 == 0);
            pNode_00 = *(Map_Node_t **)(lVar4 + 0x90 + uVar7 * 8);
            uVar5 = (uint)(uVar5 == 0);
          }
          fVar10 = Map_SwitchCutRefDeref(pNode_00,(Map_Cut_t *)(ulong)uVar5,fPhase,(int)uVar7);
          local_2c = local_2c + fVar10;
        }
LAB_00400e79:
        lVar9 = lVar9 + 1;
      } while (lVar9 < *(char *)((long)&pNode->p2 + 4));
    }
  }
  return local_2c;
}

Assistant:

float Map_SwitchCutRefDeref( Map_Node_t * pNode, Map_Cut_t * pCut, int fPhase, int fReference )
{
    Map_Node_t * pNodeChild;
    Map_Cut_t * pCutChild;
    float aSwitchActivity;
    int i, fPhaseChild;

    // start switching activity for the node
    aSwitchActivity = pNode->Switching;
    // consider the elementary variable
    if ( pCut->nLeaves == 1 )
        return aSwitchActivity;

    // go through the children
    assert( pCut->M[fPhase].pSuperBest );
    for ( i = 0; i < pCut->nLeaves; i++ )
    {
        pNodeChild  = pCut->ppLeaves[i];
        fPhaseChild = Map_CutGetLeafPhase( pCut, fPhase, i );
        // get the reference counter of the child

        if ( fReference )
        {
            if ( pNodeChild->pCutBest[0] && pNodeChild->pCutBest[1] ) // both phases are present
            {
                // if this phase of the node is referenced, there is no recursive call
                pNodeChild->nRefAct[2]++;
                if ( pNodeChild->nRefAct[fPhaseChild]++ > 0 )
                    continue;
            }
            else // only one phase is present
            {
                // inverter should be added if the phase
                // (a) has no reference and (b) is implemented using other phase
                if ( pNodeChild->nRefAct[fPhaseChild]++ == 0 && pNodeChild->pCutBest[fPhaseChild] == NULL )
                    aSwitchActivity += pNodeChild->Switching; // inverter switches the same as the node
                // if the node is referenced, there is no recursive call
                if ( pNodeChild->nRefAct[2]++ > 0 )
                    continue;
            }
        }
        else
        {
            if ( pNodeChild->pCutBest[0] && pNodeChild->pCutBest[1] ) // both phases are present
            {
                // if this phase of the node is referenced, there is no recursive call
                --pNodeChild->nRefAct[2];
                if ( --pNodeChild->nRefAct[fPhaseChild] > 0 )
                    continue;
            }
            else // only one phase is present
            {
                // inverter should be added if the phase
                // (a) has no reference and (b) is implemented using other phase
                if ( --pNodeChild->nRefAct[fPhaseChild] == 0 && pNodeChild->pCutBest[fPhaseChild] == NULL )
                    aSwitchActivity += pNodeChild->Switching; // inverter switches the same as the node
                // if the node is referenced, there is no recursive call
                if ( --pNodeChild->nRefAct[2] > 0 )
                    continue;
            }
            assert( pNodeChild->nRefAct[fPhaseChild] >= 0 );
        }

        // get the child cut
        pCutChild = pNodeChild->pCutBest[fPhaseChild];
        // if the child does not have this phase mapped, take the opposite phase
        if ( pCutChild == NULL )
        {
            fPhaseChild = !fPhaseChild;
            pCutChild   = pNodeChild->pCutBest[fPhaseChild];
        }
        // reference and compute area recursively
        aSwitchActivity += Map_SwitchCutRefDeref( pNodeChild, pCutChild, fPhaseChild, fReference );
    }
    return aSwitchActivity;
}